

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ostream * Catch::TextFlow::operator<<(ostream *os,Columns *cols)

{
  bool bVar1;
  bool bVar2;
  iterator __begin2;
  string line;
  iterator __end2;
  
  Columns::iterator::iterator(&__begin2,cols);
  Columns::iterator::iterator(&__end2,cols);
  bVar2 = true;
  while( true ) {
    bVar1 = std::operator!=(&__begin2.m_iterators,&__end2.m_iterators);
    if (!bVar1) break;
    Columns::iterator::operator*[abi_cxx11_(&line,&__begin2);
    if (!bVar2) {
      std::operator<<(os,'\n');
    }
    std::operator<<(os,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    Columns::iterator::operator++(&__begin2);
    bVar2 = false;
  }
  std::
  _Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::~_Vector_base(&__end2.m_iterators.
                   super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 );
  std::
  _Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::~_Vector_base(&__begin2.m_iterators.
                   super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 );
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, Columns const& cols ) {
            bool first = true;
            for ( auto line : cols ) {
                if ( first ) {
                    first = false;
                } else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }